

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

void __thiscall menuwindow::autoscroll(menuwindow *this,int n)

{
  int iVar1;
  Fl_Boxtype t;
  int iVar2;
  int local_28;
  int local_24;
  int ww;
  int xx;
  int Y;
  int scr_h;
  int scr_y;
  int n_local;
  menuwindow *this_local;
  
  scr_h = n;
  _scr_y = this;
  iVar1 = Fl_Widget::y((Fl_Widget *)this);
  t = Fl_Widget::box((Fl_Widget *)this);
  iVar2 = Fl::box_dx(t);
  ww = iVar1 + iVar2 + 2 + scr_h * this->itemheight;
  Fl::screen_work_area(&local_24,&Y,&local_28,&xx);
  if (Y < ww) {
    iVar1 = ((ww + this->itemheight) - xx) - Y;
    if (iVar1 < 0) {
      return;
    }
    ww = -10 - iVar1;
  }
  else {
    ww = (Y - ww) + 10;
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  Fl_Widget::position((Fl_Widget *)this,iVar1,iVar2 + ww);
  return;
}

Assistant:

void menuwindow::autoscroll(int n) {
  int scr_y, scr_h;
  int Y = y()+Fl::box_dx(box())+2+n*itemheight;

  int xx, ww;
  Fl::screen_work_area(xx, scr_y, ww, scr_h);
  if (Y <= scr_y) Y = scr_y-Y+10;
  else {
    Y = Y+itemheight-scr_h-scr_y;
    if (Y < 0) return;
    Y = -Y-10;
  }
  Fl_Menu_Window::position(x(), y()+Y);
  // y(y()+Y); // don't wait for response from X
}